

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

void opengv::absolute_pose::fill3x10(Vector3d *x,Matrix<double,_3,_10,_0,_3,_10> *Phi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  CoeffReturnType pdVar4;
  CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *this;
  CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *s;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double x3;
  double x2;
  double x1;
  Index in_stack_fffffffffffffdf8;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *in_stack_fffffffffffffe00;
  DenseBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *in_stack_fffffffffffffe08;
  CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *in_stack_fffffffffffffe10;
  
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  dVar1 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  dVar2 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  dVar3 = *pdVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator<<
            (in_stack_fffffffffffffe08,(Scalar *)in_stack_fffffffffffffe00);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  auVar11._8_8_ = 0x8000000000000000;
  auVar11._0_8_ = 0x8000000000000000;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1;
  vmovlpd_avx(auVar5 ^ auVar11);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  auVar12._8_8_ = 0x8000000000000000;
  auVar12._0_8_ = 0x8000000000000000;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  vmovlpd_avx(auVar6 ^ auVar12);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  auVar13._8_8_ = 0x8000000000000000;
  auVar13._0_8_ = 0x8000000000000000;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2;
  vmovlpd_avx(auVar7 ^ auVar13);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  auVar14._8_8_ = 0x8000000000000000;
  auVar14._0_8_ = 0x8000000000000000;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar2;
  vmovlpd_avx(auVar8 ^ auVar14);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  auVar15._8_8_ = 0x8000000000000000;
  auVar15._0_8_ = 0x8000000000000000;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar3;
  vmovlpd_avx(auVar9 ^ auVar15);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  auVar16._8_8_ = 0x8000000000000000;
  auVar16._0_8_ = 0x8000000000000000;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar3;
  vmovlpd_avx(auVar10 ^ auVar16);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
            (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
                   (in_stack_fffffffffffffe10,(Scalar *)in_stack_fffffffffffffe08);
  s = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_
                (this,(Scalar *)in_stack_fffffffffffffe08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_(this,(Scalar *)s);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_(this,(Scalar *)s);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::operator_(this,(Scalar *)s);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)0x6d3058);
  return;
}

Assistant:

void fill3x10( const Eigen::Vector3d & x, Eigen::Matrix<double,3,10> & Phi )
{
  double x1 = x[0];
  double x2 = x[1];
  double x3 = x[2];
  
  Phi << x1,  x1, -x1, -x1,     0.0,  2.0*x3, -2.0*x2, 2.0*x2, 2.0*x3,    0.0,
         x2, -x2,  x2, -x2, -2.0*x3,     0.0,  2.0*x1, 2.0*x1,    0.0, 2.0*x3,
         x3, -x3, -x3,  x3,  2.0*x2, -2.0*x1,     0.0,    0.0, 2.0*x1, 2.0*x2;
}